

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O3

void __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeQPTerms(QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
                   *this,ItemType *qc)

{
  ptr ppVar1;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  long lVar2;
  long lVar3;
  LinTerms lin_terms;
  undefined1 local_238 [72];
  ptr local_1f0;
  ulong local_1e8;
  undefined1 local_1c0 [72];
  ptr local_178;
  ulong local_170;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> local_148;
  LinTerms local_a8;
  
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)local_238,&qc->super_QuadAndLinTerms);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_1f0,
             &(qc->super_QuadAndLinTerms).super_LinTerms.vars_);
  if (0 < (int)(qc->super_QuadAndLinTerms).super_QuadTerms.folded_.
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
               .m_size) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      ppVar1 = (qc->super_QuadAndLinTerms).super_QuadTerms.folded_.
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
               .m_data_ptr;
      LinearizeQPTerm(&local_a8,this,*(double *)((long)&(ppVar1->first).first + lVar2),
                      *(int *)((long)ppVar1 + lVar2 + -8),*(int *)((long)ppVar1 + lVar2 + -4));
      LinTerms::add((LinTerms *)local_238,&local_a8);
      if (6 < local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_a8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_a8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < (int)(qc->super_QuadAndLinTerms).super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_size);
  }
  LinTerms::sort_terms((LinTerms *)local_238,true);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)local_1c0,local_238);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_178,&local_1f0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (&local_148,(LinTerms *)local_1c0,(AlgConRhs<0>)(qc->super_AlgConRhs<0>).rhs_,true);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
            (this_00,&local_148);
  if (6 < local_148.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_148.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_148.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_148.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_148.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_148.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_148.super_BasicConstraint.name_.field_2) {
    operator_delete(local_148.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_148.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_170) {
    operator_delete(local_178,local_170 << 2);
  }
  if (6 < (ulong)local_1c0._8_8_) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._8_8_ << 3);
  }
  if (6 < local_1e8) {
    operator_delete(local_1f0,local_1e8 << 2);
  }
  if (6 < (ulong)local_238._8_8_) {
    operator_delete((void *)local_238._0_8_,local_238._8_8_ << 3);
  }
  return;
}

Assistant:

void LinearizeQPTerms(const ItemType& qc) {
    const auto& body = qc.GetBody();
    // Copy lin terms
    auto lin_terms = body.GetLinTerms();
    // Convert quadratic terms
    const auto& qp_terms = body.GetQPTerms();
    for (int i=0; i<(int)qp_terms.size(); ++i) {
      auto c = qp_terms.coef(i);
      auto x = qp_terms.var1(i);
      auto y = qp_terms.var2(i);
      lin_terms.add( LinearizeQPTerm(c, x, y) );
    }
    // Sort linear body. AS_ROOT propagates context
    lin_terms.sort_terms();
    GetMC().AddConstraint_AS_ROOT( LinConRhs< sens >{
                             lin_terms, qc.GetRhsOrRange() } );
  }